

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

Arg * __thiscall fmt::ArgList::operator[](Arg *__return_storage_ptr__,ArgList *this,uint index)

{
  LongLong *pLVar1;
  Arg *pAVar2;
  Type *pTVar3;
  ulong uVar4;
  Arg *pAVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  Type TVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  LongLong local_18;
  size_t sStack_10;
  
  uVar4 = this->types_;
  if (index < 0x10) {
    uVar7 = uVar4 >> ((char)index * '\x04' & 0x3fU);
    if ((uVar7 & 0xf) != 0) {
      pLVar1 = (LongLong *)
               ((long)&((this->field_1).values_)->field_0 +
               ((ulong)index << (uVar4 >> 0x3c == 0 ^ 5U)));
      local_18 = *pLVar1;
      sStack_10 = pLVar1[1];
    }
    (__return_storage_ptr__->super_Value).field_0.long_long_value = local_18;
    (__return_storage_ptr__->super_Value).field_0.string.size = sStack_10;
    __return_storage_ptr__->type = (Type)uVar7 & (CUSTOM|NAMED_ARG);
    return __return_storage_ptr__;
  }
  if (uVar4 >> 0x3c == 0) {
    __return_storage_ptr__->type = NONE;
    return __return_storage_ptr__;
  }
  pAVar5 = (this->field_1).args_;
  uVar6 = 0x10;
  do {
    if (pAVar5[uVar6].type == NONE) {
      pAVar5 = pAVar5 + uVar6;
      iVar8 = (pAVar5->super_Value).field_0.int_value;
      uVar9 = *(undefined4 *)((long)&(pAVar5->super_Value).field_0 + 4);
      uVar10 = *(undefined4 *)((long)&(pAVar5->super_Value).field_0 + 8);
      uVar11 = *(undefined4 *)((long)&(pAVar5->super_Value).field_0 + 0xc);
      TVar12 = pAVar5->type;
      uVar13 = *(undefined4 *)&pAVar5->field_0x14;
      uVar14 = *(undefined4 *)&pAVar5->field_0x18;
      uVar15 = *(undefined4 *)&pAVar5->field_0x1c;
      goto LAB_00492e16;
    }
    uVar6 = uVar6 + 1;
  } while (uVar6 <= index);
  pAVar2 = pAVar5 + index;
  iVar8 = (pAVar2->super_Value).field_0.int_value;
  uVar9 = *(undefined4 *)((long)&(pAVar2->super_Value).field_0 + 4);
  uVar10 = *(undefined4 *)((long)&(pAVar2->super_Value).field_0 + 8);
  uVar11 = *(undefined4 *)((long)&(pAVar2->super_Value).field_0 + 0xc);
  pTVar3 = &pAVar5[index].type;
  TVar12 = *pTVar3;
  uVar13 = pTVar3[1];
  uVar14 = pTVar3[2];
  uVar15 = pTVar3[3];
LAB_00492e16:
  __return_storage_ptr__->type = TVar12;
  *(undefined4 *)&__return_storage_ptr__->field_0x14 = uVar13;
  *(undefined4 *)&__return_storage_ptr__->field_0x18 = uVar14;
  *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar15;
  (__return_storage_ptr__->super_Value).field_0.int_value = iVar8;
  *(undefined4 *)((long)&(__return_storage_ptr__->super_Value).field_0 + 4) = uVar9;
  *(undefined4 *)((long)&(__return_storage_ptr__->super_Value).field_0 + 8) = uVar10;
  *(undefined4 *)((long)&(__return_storage_ptr__->super_Value).field_0 + 0xc) = uVar11;
  return __return_storage_ptr__;
}

Assistant:

internal::Arg operator[](unsigned index) const {
    using internal::Arg;
    Arg arg;
    bool use_values = type(MAX_PACKED_ARGS - 1) == Arg::NONE;
    if (index < MAX_PACKED_ARGS) {
      Arg::Type arg_type = type(index);
      internal::Value &val = arg;
      if (arg_type != Arg::NONE)
        val = use_values ? values_[index] : args_[index];
      arg.type = arg_type;
      return arg;
    }
    if (use_values) {
      // The index is greater than the number of arguments that can be stored
      // in values, so return a "none" argument.
      arg.type = Arg::NONE;
      return arg;
    }
    for (unsigned i = MAX_PACKED_ARGS; i <= index; ++i) {
      if (args_[i].type == Arg::NONE)
        return args_[i];
    }
    return args_[index];
  }